

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void CompareTableFieldValue<float>(Table *table,int voffset,float val)

{
  ushort uVar1;
  float expval;
  
  if ((ushort)voffset < *(ushort *)(table + -(long)*(int *)table)) {
    uVar1 = *(ushort *)(table + (((ulong)(uint)voffset & 0xffff) - (long)*(int *)table));
  }
  else {
    uVar1 = 0;
  }
  if (uVar1 == 0) {
    expval = 0.0;
  }
  else {
    expval = *(float *)(table + uVar1);
  }
  TestEq<float,float>(expval,val,"read",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/tests/test.cpp"
                      ,0xb4);
  return;
}

Assistant:

void CompareTableFieldValue(flatbuffers::Table *table,
                                                 int voffset, T val) {
  T read = table->GetField(voffset, static_cast<T>(0));
  TEST_EQ(read, val);
}